

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O1

string * formatTime_abi_cxx11_(string *__return_storage_ptr__,time_t seconds)

{
  size_t sVar1;
  ulong uVar2;
  char *__format;
  float fVar3;
  char formatted [24];
  char local_28 [24];
  
  fVar3 = (float)seconds / 86400.0;
  if (seconds < 0x1e13380) {
    if (seconds < 0x6ebe00) {
      if (seconds < 0x112380) {
        if (seconds < 0x15180) {
          if (seconds < 0xe10) {
            if (seconds < 0x3c) {
              if (seconds < 1) {
                local_28[0] = '-';
                local_28[1] = '\0';
                goto LAB_00114778;
              }
              __format = "%d s";
              uVar2 = seconds & 0xffffffff;
            }
            else {
              uVar2 = (ulong)seconds / 0x3c;
              __format = "%d m";
            }
          }
          else {
            uVar2 = (ulong)seconds / 0xe10;
            __format = "%d h";
          }
        }
        else {
          uVar2 = (ulong)(uint)(int)fVar3;
          __format = "%d d";
        }
      }
      else {
        uVar2 = (ulong)(uint)(int)(fVar3 / 7.0);
        __format = "%d wk";
      }
    }
    else {
      uVar2 = (ulong)(uint)(int)(fVar3 / 30.0);
      __format = "%1d mo";
    }
    snprintf(local_28,0x18,__format,uVar2);
  }
  else {
    snprintf(local_28,0x18,"%.1f y",(double)fVar3 / 365.0);
  }
LAB_00114778:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_28);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_28,local_28 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string formatTime (time_t seconds)
{
  char formatted[24];
  float days = (float) seconds / 86400.0;

       if (seconds >= 86400 * 365) snprintf (formatted, sizeof(formatted), "%.1f y", (days / 365.0));
  else if (seconds >= 86400 * 84)  snprintf (formatted, sizeof(formatted), "%1d mo", (int) (days / 30));
  else if (seconds >= 86400 * 13)  snprintf (formatted, sizeof(formatted), "%d wk",  (int) (float) (days / 7.0));
  else if (seconds >= 86400)       snprintf (formatted, sizeof(formatted), "%d d",   (int) days);
  else if (seconds >= 3600)        snprintf (formatted, sizeof(formatted), "%d h",   (int) (seconds / 3600));
  else if (seconds >= 60)          snprintf (formatted, sizeof(formatted), "%d m",   (int) (seconds / 60));
  else if (seconds >= 1)           snprintf (formatted, sizeof(formatted), "%d s",   (int) seconds);
#ifdef HAVE_STRLCPY
  else                             strlcpy (formatted, "-", sizeof(formatted));
#else
  else                             strcpy (formatted, "-");
#endif /* HAVE_STRLCPY */

  return std::string (formatted);
}